

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_handle_message(ptls_t *tls,ptls_buffer_t *sendbuf,size_t *epoch_offsets,size_t in_epoch,
                       void *input,size_t inlen,ptls_handshake_properties_t *properties)

{
  ptls_private_key_method_t *ppVar1;
  int iVar2;
  size_t sVar3;
  st_ptls_record_t rec;
  st_ptls_raw_message_emitter_t emitter;
  
  emitter.super.enc = &(tls->traffic_protection).enc;
  emitter.super.record_header_length = 0;
  emitter.super.begin_message = begin_raw_message;
  emitter.super.commit_message = commit_raw_message;
  emitter.start_off = 0xffffffffffffffff;
  rec.type = '\x16';
  rec.version = 0;
  rec.length = inlen;
  rec.fragment = (uint8_t *)input;
  emitter.super.buf = sendbuf;
  emitter.epoch_offsets = epoch_offsets;
  if (input == (void *)0x0) {
    iVar2 = send_client_hello(tls,&emitter.super,properties,(ptls_iovec_t *)0x0);
  }
  else {
    sVar3 = ptls_get_read_epoch(tls);
    if (sVar3 == in_epoch) {
      ppVar1 = tls->ctx->private_key_method;
      tls->ctx->private_key_method = (ptls_private_key_method_t *)0x0;
      iVar2 = handle_handshake_record
                        (tls,(_func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
                              *)&emitter,(ptls_message_emitter_t *)&rec,
                         (st_ptls_record_t *)properties,(ptls_handshake_properties_t *)input);
      tls->ctx->private_key_method = ppVar1;
    }
    else {
      iVar2 = 10;
    }
  }
  return iVar2;
}

Assistant:

int ptls_handle_message(ptls_t *tls, ptls_buffer_t *sendbuf, size_t epoch_offsets[5], size_t in_epoch, const void *input,
                        size_t inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_raw_message_emitter_t emitter = {
        {sendbuf, &tls->traffic_protection.enc, 0, begin_raw_message, commit_raw_message}, SIZE_MAX, epoch_offsets};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0, inlen, input};

    if (input == NULL)
        return send_client_hello(tls, &emitter.super, properties, NULL);

    if (ptls_get_read_epoch(tls) != in_epoch)
        return PTLS_ALERT_UNEXPECTED_MESSAGE;

    /* This is a back-door so do not handle private keys here.  */
    int rc;
    ptls_private_key_method_t *method = tls->ctx->private_key_method;
    tls->ctx->private_key_method = NULL;
    rc = handle_handshake_record(tls, handle_handshake_message, &emitter.super, &rec, properties);
    tls->ctx->private_key_method = method;
    return rc;
}